

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_hub.cpp
# Opt level: O3

void G_ReadHubInfo(PNGHandle *png)

{
  uint uVar1;
  FPNGChunkArchive arc;
  FPNGChunkArchive FStack_308;
  
  uVar1 = M_FindPNGChunk(png,0x73427568);
  if (uVar1 != 0) {
    FPNGChunkArchive::FPNGChunkArchive(&FStack_308,png->File->File,0x73427568,(long)(int)uVar1);
    G_SerializeHub(&FStack_308.super_FArchive);
    FPNGChunkArchive::~FPNGChunkArchive(&FStack_308);
  }
  return;
}

Assistant:

void G_ReadHubInfo (PNGHandle *png)
{
	int chunklen;

	if ((chunklen = M_FindPNGChunk (png, HUBS_ID)) != 0)
	{
		FPNGChunkArchive arc (png->File->GetFile(), HUBS_ID, chunklen);
		G_SerializeHub(arc);
	}
}